

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

void __thiscall
siamese::RecoveryMatrixState::ResumeGE(RecoveryMatrixState *this,uint oldRows,uint rows)

{
  ulong uVar1;
  uint8_t uVar2;
  uint8_t y;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  RowInfo *pRVar6;
  uint uVar7;
  uint newRowIndex;
  uint uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong local_68;
  
  if (oldRows < rows) {
    uVar3 = (this->Matrix).AllocatedColumns;
    local_68 = 1;
    uVar10 = 0;
    while ((uint)uVar10 < this->GEResumePivot) {
      puVar5 = (this->Matrix).Data;
      uVar4 = (this->Pivots).DataPtr[(int)(uint)uVar10];
      uVar7 = uVar4 * uVar3;
      uVar4 = (this->Rows).DataPtr[(int)uVar4].MatrixColumnCount;
      uVar1 = uVar10 + 1;
      puVar9 = puVar5 + uVar3 * oldRows;
      uVar2 = puVar5[(uVar10 & 0xffffffff) + (ulong)uVar7];
      for (uVar8 = oldRows; uVar8 < rows; uVar8 = uVar8 + 1) {
        if (puVar9[uVar10] != '\0') {
          y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar2,puVar9[uVar10])];
          puVar9[uVar10] = y;
          gf256_muladd_mem(puVar9 + local_68,y,puVar5 + (uVar1 & 0xffffffff) + (ulong)uVar7,
                           uVar4 - (int)uVar1);
          pRVar6 = (this->Rows).DataPtr;
          if (pRVar6[(int)uVar8].MatrixColumnCount < uVar4) {
            pRVar6[(int)uVar8].MatrixColumnCount = uVar4;
          }
        }
        puVar9 = puVar9 + uVar3;
      }
      local_68 = (ulong)((int)local_68 + 1);
      uVar10 = uVar1;
    }
  }
  return;
}

Assistant:

void RecoveryMatrixState::ResumeGE(const unsigned oldRows, const unsigned rows)
{
    // If we did not add any new rows:
    if (oldRows >= rows)
    {
        SIAMESE_DEBUG_ASSERT(oldRows == rows);
        return;
    }

    const unsigned stride = Matrix.AllocatedColumns;

    // For each pivot we have determined already:
    for (unsigned pivot_i = 0; pivot_i < GEResumePivot; ++pivot_i)
    {
        // Get the row for that pivot
        const unsigned matrixRowIndex_i = Pivots.GetRef(pivot_i);
        const uint8_t* ge_row = Matrix.Data + stride * matrixRowIndex_i;
        const uint8_t val_i   = ge_row[pivot_i];
        SIAMESE_DEBUG_ASSERT(val_i != 0);

        const unsigned pivotColumnCount = Rows.GetRef(matrixRowIndex_i).MatrixColumnCount;

        uint8_t* rem_row = Matrix.Data + stride * oldRows;

        // For each new row that was added:
        for (unsigned newRowIndex = oldRows; newRowIndex < rows; ++newRowIndex, rem_row += stride)
        {
            if (EliminateRow(ge_row, rem_row, pivot_i, pivotColumnCount, val_i))
            {
                // Grow the column count of this row if we just filled it in on the right
                if (Rows.GetRef(newRowIndex).MatrixColumnCount < pivotColumnCount)
                    Rows.GetRef(newRowIndex).MatrixColumnCount = pivotColumnCount;
            }
            SIAMESE_DEBUG_ASSERT(Pivots.GetRef(newRowIndex) == newRowIndex);
        }
    }
}